

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaB_pairs(lua_State *L)

{
  int iVar1;
  
  luaL_checkany(L,1);
  iVar1 = luaL_getmetafield(L,1,"__pairs");
  if (iVar1 == 0) {
    lua_pushcclosure(L,luaB_next,0);
    lua_pushvalue(L,1);
    lua_pushnil(L);
  }
  else {
    lua_pushvalue(L,1);
    lua_callk(L,1,3,0,pairscont);
  }
  return 3;
}

Assistant:

static int luaB_pairs (lua_State *L) {
  luaL_checkany(L, 1);
  if (luaL_getmetafield(L, 1, "__pairs") == LUA_TNIL) {  /* no metamethod? */
    lua_pushcfunction(L, luaB_next);  /* will return generator, */
    lua_pushvalue(L, 1);  /* state, */
    lua_pushnil(L);  /* and initial value */
  }
  else {
    lua_pushvalue(L, 1);  /* argument 'self' to metamethod */
    lua_callk(L, 1, 3, 0, pairscont);  /* get 3 values from metamethod */
  }
  return 3;
}